

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_set.c
# Opt level: O0

int x509_sig_info_init(X509_SIG_INFO *siginf,X509_ALGOR *alg,ASN1_STRING *sig)

{
  int iVar1;
  int iVar2;
  EVP_PKEY_ASN1_METHOD *pEVar3;
  char *name;
  EVP_MD *file;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  EVP_PKEY_ASN1_METHOD *ameth;
  EVP_MD *md;
  int mdnid;
  int pknid;
  EVP_MD *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  undefined8 local_20;
  undefined8 *local_18;
  int *local_10;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = -1;
  in_RDI[3] = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)*in_RSI);
  iVar1 = OBJ_find_sigid_algs(iVar1,&local_28,&local_24);
  if ((iVar1 == 0) || (local_24 == 0)) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffd0,iVar2,
                  (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ERR_set_error(0xb,0x90,(char *)0x0);
    local_4 = 0;
  }
  else {
    *local_10 = local_28;
    local_10[1] = local_24;
    if (local_28 == 0) {
      iVar1 = local_28;
      pEVar3 = EVP_PKEY_asn1_find((ENGINE **)0x0,local_24);
      if (((pEVar3 == (EVP_PKEY_ASN1_METHOD *)0x0) || (*(long *)(pEVar3 + 0xd8) == 0)) ||
         (iVar2 = (**(code **)(pEVar3 + 0xd8))(local_10,local_18,local_20), iVar2 == 0)) {
        iVar2 = (int)((ulong)pEVar3 >> 0x20);
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffd0,iVar2,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
        ERR_set_error(0xb,0x8e,(char *)0x0);
        return 0;
      }
    }
    else if (local_28 == 4) {
      local_10[2] = 0x27;
    }
    else if (local_28 == 0x40) {
      local_10[2] = 0x3f;
    }
    else if (local_28 == 0x329) {
      local_10[2] = 0x69;
    }
    else {
      iVar1 = local_28;
      name = OBJ_nid2sn(local_28);
      file = EVP_get_digestbyname(name);
      if (file == (EVP_MD *)0x0) {
        ERR_new();
        ERR_set_debug((char *)file,iVar2,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
        ERR_set_error(0xb,0x8d,(char *)0x0);
        return 0;
      }
      iVar1 = EVP_MD_get_size(in_stack_ffffffffffffffb8);
      local_10[2] = iVar1 << 2;
    }
    if ((local_28 == 0x40) || (local_28 - 0x2a0U < 3)) {
      local_10[3] = local_10[3] | 2;
    }
    local_10[3] = local_10[3] | 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int x509_sig_info_init(X509_SIG_INFO *siginf, const X509_ALGOR *alg,
                              const ASN1_STRING *sig)
{
    int pknid, mdnid;
    const EVP_MD *md;
    const EVP_PKEY_ASN1_METHOD *ameth;

    siginf->mdnid = NID_undef;
    siginf->pknid = NID_undef;
    siginf->secbits = -1;
    siginf->flags = 0;
    if (!OBJ_find_sigid_algs(OBJ_obj2nid(alg->algorithm), &mdnid, &pknid)
            || pknid == NID_undef) {
        ERR_raise(ERR_LIB_X509, X509_R_UNKNOWN_SIGID_ALGS);
        return 0;
    }
    siginf->mdnid = mdnid;
    siginf->pknid = pknid;

    switch (mdnid) {
    case NID_undef:
        /* If we have one, use a custom handler for this algorithm */
        ameth = EVP_PKEY_asn1_find(NULL, pknid);
        if (ameth == NULL || ameth->siginf_set == NULL
                || !ameth->siginf_set(siginf, alg, sig)) {
            ERR_raise(ERR_LIB_X509, X509_R_ERROR_USING_SIGINF_SET);
            return 0;
        }
        break;
        /*
         * SHA1 and MD5 are known to be broken. Reduce security bits so that
         * they're no longer accepted at security level 1.
         * The real values don't really matter as long as they're lower than 80,
         * which is our security level 1.
         */
    case NID_sha1:
        /*
         * https://eprint.iacr.org/2020/014 puts a chosen-prefix attack
         * for SHA1 at2^63.4
         */
        siginf->secbits = 63;
        break;
    case NID_md5:
        /*
         * https://documents.epfl.ch/users/l/le/lenstra/public/papers/lat.pdf
         * puts a chosen-prefix attack for MD5 at 2^39.
         */
        siginf->secbits = 39;
        break;
    case NID_id_GostR3411_94:
        /*
         * There is a collision attack on GOST R 34.11-94 at 2^105, see
         * https://link.springer.com/chapter/10.1007%2F978-3-540-85174-5_10
         */
        siginf->secbits = 105;
        break;
    default:
        /* Security bits: half number of bits in digest */
        if ((md = EVP_get_digestbynid(mdnid)) == NULL) {
            ERR_raise(ERR_LIB_X509, X509_R_ERROR_GETTING_MD_BY_NID);
            return 0;
        }
        siginf->secbits = EVP_MD_get_size(md) * 4;
        break;
    }
    switch (mdnid) {
    case NID_sha1:
    case NID_sha256:
    case NID_sha384:
    case NID_sha512:
        siginf->flags |= X509_SIG_INFO_TLS;
    }
    siginf->flags |= X509_SIG_INFO_VALID;
    return 1;
}